

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqcompiler.cpp
# Opt level: O2

void __thiscall SQCompiler::ForEachStatement(SQCompiler *this)

{
  SQUnsignedInteger *pSVar1;
  SQUnsignedInteger SVar2;
  SQUnsignedInteger pos;
  SQUnsignedInteger SVar3;
  SQUnsignedInteger SVar4;
  SQInteger SVar5;
  SQInteger arg0;
  long lVar6;
  SQFuncState *pSVar7;
  long lVar8;
  SQObject SVar9;
  SQObject local_88;
  SQObject local_78;
  long local_68;
  SQInteger local_60;
  SQObject local_58;
  SQScope __oldscope__;
  
  Lex(this);
  Expect(this,0x28);
  SVar9 = Expect(this,0x102);
  local_88._unVal = SVar9._unVal;
  local_88._type = SVar9._type;
  if (this->_token == 0x2c) {
    local_78._4_4_ = local_88._4_4_;
    local_78._type = local_88._type;
    local_78._unVal.nInteger = local_88._unVal.nInteger;
    Lex(this);
    SVar9 = Expect(this,0x102);
    local_88._unVal = SVar9._unVal;
    local_88._type = SVar9._type;
  }
  else {
    SVar9 = SQFuncState::CreateString(this->_fs,"@INDEX@",-1);
    local_78._unVal = SVar9._unVal;
    local_78._type = SVar9._type;
  }
  Expect(this,0x118);
  __oldscope__.outers = (this->_scope).outers;
  __oldscope__.stacksize = (this->_scope).stacksize;
  pSVar7 = this->_fs;
  (this->_scope).outers = pSVar7->_outers;
  SVar5 = SQFuncState::GetStackSize(pSVar7);
  (this->_scope).stacksize = SVar5;
  Expression(this);
  Expect(this,0x29);
  local_60 = SQFuncState::TopTarget(this->_fs);
  arg0 = SQFuncState::PushLocalVariable(this->_fs,&local_78);
  SQFuncState::AddInstruction(this->_fs,_OP_LOADNULLS,arg0,1,0,0);
  SVar5 = SQFuncState::PushLocalVariable(this->_fs,&local_88);
  SQFuncState::AddInstruction(this->_fs,_OP_LOADNULLS,SVar5,1,0,0);
  pSVar7 = this->_fs;
  SVar9 = SQFuncState::CreateString(pSVar7,"@ITERATOR@",-1);
  local_58._unVal = SVar9._unVal;
  local_58._type = SVar9._type;
  SVar5 = SQFuncState::PushLocalVariable(pSVar7,&local_58);
  SQFuncState::AddInstruction(this->_fs,_OP_LOADNULLS,SVar5,1,0,0);
  SVar5 = local_60;
  SVar2 = (this->_fs->_instructions)._size;
  SQFuncState::AddInstruction(this->_fs,_OP_FOREACH,local_60,0,arg0,0);
  pos = (this->_fs->_instructions)._size;
  local_68 = pos - 1;
  SQFuncState::AddInstruction(this->_fs,_OP_POSTFOREACH,SVar5,0,arg0,0);
  pSVar7 = this->_fs;
  SVar3 = (pSVar7->_unresolvedbreaks)._size;
  SVar4 = (pSVar7->_unresolvedcontinues)._size;
  local_58._type = 0;
  local_58._4_4_ = 0;
  sqvector<long_long>::push_back(&pSVar7->_breaktargets,(longlong *)&local_58);
  local_58._type = 0;
  local_58._4_4_ = 0;
  sqvector<long_long>::push_back(&this->_fs->_continuetargets,(longlong *)&local_58);
  Statement(this,true);
  SQFuncState::AddInstruction(this->_fs,_OP_JMP,0,~(this->_fs->_instructions)._size + SVar2,0,0);
  SQFuncState::SetInstructionParam(this->_fs,local_68,1,(this->_fs->_instructions)._size - pos);
  SQFuncState::SetInstructionParam(this->_fs,pos,1,(this->_fs->_instructions)._size - pos);
  pSVar7 = this->_fs;
  lVar8 = (pSVar7->_unresolvedbreaks)._size - SVar3;
  lVar6 = (pSVar7->_unresolvedcontinues)._size - SVar4;
  if (0 < lVar6) {
    ResolveContinues(this,pSVar7,lVar6,pos - 2);
    pSVar7 = this->_fs;
  }
  if (0 < lVar8) {
    ResolveBreaks(this,pSVar7,lVar8);
    pSVar7 = this->_fs;
  }
  pSVar1 = &(pSVar7->_breaktargets)._size;
  *pSVar1 = *pSVar1 - 1;
  pSVar1 = &(pSVar7->_continuetargets)._size;
  *pSVar1 = *pSVar1 - 1;
  SQFuncState::PopTarget(pSVar7);
  lVar6 = this->_fs->_outers;
  SVar5 = SQFuncState::GetStackSize(this->_fs);
  lVar8 = (this->_scope).stacksize;
  if (SVar5 != lVar8) {
    SQFuncState::SetStackSize(this->_fs,lVar8);
    if (lVar6 != this->_fs->_outers) {
      SQFuncState::AddInstruction(this->_fs,_OP_CLOSE,0,(this->_scope).stacksize,0,0);
    }
  }
  (this->_scope).outers = __oldscope__.outers;
  (this->_scope).stacksize = __oldscope__.stacksize;
  return;
}

Assistant:

void ForEachStatement()
    {
        SQObject idxname, valname;
        Lex(); Expect(_SC('(')); valname = Expect(TK_IDENTIFIER);
        if(_token == _SC(',')) {
            idxname = valname;
            Lex(); valname = Expect(TK_IDENTIFIER);
        }
        else{
            idxname = _fs->CreateString(_SC("@INDEX@"));
        }
        Expect(TK_IN);

        //save the stack size
        BEGIN_SCOPE();
        //put the table in the stack(evaluate the table expression)
        Expression(); Expect(_SC(')'));
        SQInteger container = _fs->TopTarget();
        //push the index local var
        SQInteger indexpos = _fs->PushLocalVariable(idxname);
        _fs->AddInstruction(_OP_LOADNULLS, indexpos,1);
        //push the value local var
        SQInteger valuepos = _fs->PushLocalVariable(valname);
        _fs->AddInstruction(_OP_LOADNULLS, valuepos,1);
        //push reference index
        SQInteger itrpos = _fs->PushLocalVariable(_fs->CreateString(_SC("@ITERATOR@"))); //use invalid id to make it inaccessible
        _fs->AddInstruction(_OP_LOADNULLS, itrpos,1);
        SQInteger jmppos = _fs->GetCurrentPos();
        _fs->AddInstruction(_OP_FOREACH, container, 0, indexpos);
        SQInteger foreachpos = _fs->GetCurrentPos();
        _fs->AddInstruction(_OP_POSTFOREACH, container, 0, indexpos);
        //generate the statement code
        BEGIN_BREAKBLE_BLOCK()
        Statement();
        _fs->AddInstruction(_OP_JMP, 0, jmppos - _fs->GetCurrentPos() - 1);
        _fs->SetInstructionParam(foreachpos, 1, _fs->GetCurrentPos() - foreachpos);
        _fs->SetInstructionParam(foreachpos + 1, 1, _fs->GetCurrentPos() - foreachpos);
        END_BREAKBLE_BLOCK(foreachpos - 1);
        //restore the local variable stack(remove index,val and ref idx)
        _fs->PopTarget();
        END_SCOPE();
    }